

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnTable
          (BinaryReaderLogging *this,Index index,Type elem_type,Limits *elem_limits)

{
  Stream *this_00;
  Enum EVar1;
  undefined8 uVar2;
  string local_b8;
  char local_98 [8];
  char buf [100];
  Limits *elem_limits_local;
  Index index_local;
  BinaryReaderLogging *this_local;
  Type elem_type_local;
  
  unique0x100000df = elem_limits;
  unique0x100000e7 = elem_type;
  anon_unknown_21::SPrintLimits(local_98,100,elem_limits);
  WriteIndent(this);
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_b8,(Type *)((long)&this_local + 4));
  uVar2 = std::__cxx11::string::c_str();
  Stream::Writef(this_00,"OnTable(index: %u, elem_type: %s, %s)\n",(ulong)index,uVar2,local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x1e])
                    (this->reader_,(ulong)index,stack0xffffffffffffffec,stack0xffffffffffffffd0);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnTable(Index index,
                                    Type elem_type,
                                    const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnTable(index: %" PRIindex ", elem_type: %s, %s)\n", index,
       elem_type.GetName().c_str(), buf);
  return reader_->OnTable(index, elem_type, elem_limits);
}